

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

stbtt_uint32 stbtt__cff_int(stbtt__buf *b)

{
  byte bVar1;
  byte bVar2;
  stbtt_uint8 sVar3;
  stbtt_uint32 sVar4;
  int iStack_20;
  
  bVar1 = stbtt__buf_get8(b);
  if ((byte)(bVar1 - 0x20) < 0xd7) {
    sVar4 = bVar1 - 0x8b;
  }
  else if ((byte)(bVar1 + 9) < 4) {
    bVar2 = stbtt__buf_get8(b);
    sVar4 = ((uint)bVar1 * 0x100 + (uint)bVar2) - 0xf694;
  }
  else {
    if (3 < (byte)(bVar1 + 5)) {
      if (bVar1 == 0x1d) {
        iStack_20 = 4;
      }
      else {
        if (bVar1 != 0x1c) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imstb_truetype.h"
                        ,0x4ab,"stbtt_uint32 stbtt__cff_int(stbtt__buf *)");
        }
        iStack_20 = 2;
      }
      sVar4 = stbtt__buf_get(b,iStack_20);
      return sVar4;
    }
    sVar3 = stbtt__buf_get8(b);
    sVar4 = 0xfa94 - CONCAT11(bVar1,sVar3);
  }
  return sVar4;
}

Assistant:

static stbtt_uint32 stbtt__cff_int(stbtt__buf *b)
{
   int b0 = stbtt__buf_get8(b);
   if (b0 >= 32 && b0 <= 246)       return b0 - 139;
   else if (b0 >= 247 && b0 <= 250) return (b0 - 247)*256 + stbtt__buf_get8(b) + 108;
   else if (b0 >= 251 && b0 <= 254) return -(b0 - 251)*256 - stbtt__buf_get8(b) - 108;
   else if (b0 == 28)               return stbtt__buf_get16(b);
   else if (b0 == 29)               return stbtt__buf_get32(b);
   STBTT_assert(0);
   return 0;
}